

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

Vector3<double> *
s2pred::GetCircumcenter<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *a,Vector3<double> *b,
          Vector3<double> *c,double *error)

{
  double dVar1;
  double dVar2;
  FloatType FVar3;
  FloatType FVar4;
  FloatType FVar5;
  FloatType FVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector3<double> local_e8;
  Vector3<double> local_c8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar1 = b->c_[2];
  local_38 = a->c_[2] - dVar1;
  dVar2 = b->c_[0];
  dVar11 = b->c_[1];
  local_48 = a->c_[0] - dVar2;
  dStack_40 = a->c_[1] - dVar11;
  dVar10 = a->c_[1] + dVar11;
  dVar8 = c->c_[2];
  dVar7 = dVar1 - dVar8;
  dVar9 = c->c_[0];
  dVar12 = a->c_[2] + dVar1;
  dVar13 = a->c_[0] + dVar2;
  local_78 = local_48 * dVar10 - dVar13 * dStack_40;
  dVar14 = dVar2 - dVar9;
  dVar15 = dVar11 - c->c_[1];
  dVar11 = dVar11 + c->c_[1];
  local_88 = dVar12 * dStack_40 - local_38 * dVar10;
  dStack_80 = local_38 * dVar13 - dVar12 * local_48;
  local_68 = dVar14;
  dStack_60 = dVar15;
  local_58 = dVar7;
  FVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88);
  FVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_48);
  dVar8 = dVar8 + dVar1;
  dVar9 = dVar9 + dVar2;
  local_98 = dVar11 * dVar14 - dVar9 * dVar15;
  local_a8 = dVar15 * dVar8 - dVar7 * dVar11;
  dStack_a0 = dVar9 * dVar7 - dVar8 * dVar14;
  FVar5 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_a8);
  FVar6 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68);
  local_c8.c_[0] = dVar12 * dStack_80 - local_78 * dVar10;
  local_c8.c_[1] = dVar13 * local_78 - local_88 * dVar12;
  local_c8.c_[2] = dVar10 * local_88 - dVar13 * dStack_80;
  local_e8.c_[0] = dVar8 * dStack_a0 - local_98 * dVar11;
  local_e8.c_[1] = dVar9 * local_98 - local_a8 * dVar8;
  local_e8.c_[2] = dVar11 * local_a8 - dVar9 * dStack_a0;
  *error = (FVar3 + FVar5) * 2.732694335895138e-30 +
           ((FVar6 + FVar4) * 8.881784197001252e-16 + 6.391467286720804e-15) * FVar3 * FVar5 +
           1.8669045833583425e-60;
  Vector3<double>::CrossProd(&local_c8,&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}